

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O2

wchar_t weight_remaining(player *p)

{
  return ~p->upkeep->total_weight + adj_str_wgt[(p->state).stat_ind[0]] * 0x3c;
}

Assistant:

int weight_remaining(struct player *p)
{
	int i;

	/* Weight limit based only on strength */
	i = 60 * adj_str_wgt[p->state.stat_ind[STAT_STR]]
		- p->upkeep->total_weight - 1;

	/* Return the result */
	return (i);
}